

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall JsonArray_SingleElement_Test::TestBody(JsonArray_SingleElement_Test *this)

{
  bool bVar1;
  int iVar2;
  MockSpec<std::error_code_()> *pMVar3;
  TypedExpectation<std::error_code_()> *pTVar4;
  MockSpec<std::error_code_(unsigned_long)> *this_00;
  TypedExpectation<std::error_code_(unsigned_long)> *this_01;
  error_code *this_02;
  Message *message;
  char *pcVar5;
  extensions extensions;
  mock_json_callbacks *in_RSI;
  mock_json_callbacks *this_03;
  char *in_R9;
  span<const_char,__1L> sVar6;
  AssertHelper local_1e0;
  Message local_1d8;
  coord local_1d0;
  coord local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_190;
  Message local_188;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_;
  allocator local_151;
  undefined1 local_150 [8];
  string input;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  MockSpec<std::error_code_()> local_88;
  WithoutMatchers local_71;
  Matcher<unsigned_long> local_70;
  MockSpec<std::error_code_(unsigned_long)> local_58;
  WithoutMatchers local_35 [13];
  MockSpec<std::error_code_()> local_28;
  InSequence local_11;
  JsonArray_SingleElement_Test *pJStack_10;
  InSequence _;
  JsonArray_SingleElement_Test *this_local;
  
  pJStack_10 = this;
  testing::InSequence::InSequence(&local_11);
  local_28.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_begin_array
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonArray).callbacks_,in_RSI);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_28,local_35,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0x48,"callbacks_","begin_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar4,1);
  testing::Matcher<unsigned_long>::Matcher(&local_70,1);
  mock_json_callbacks::gmock_uint64_value
            (&local_58,&(this->super_JsonArray).callbacks_.super_mock_json_callbacks,&local_70);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::operator()
                      (&local_58,&local_71,(void *)0x0);
  this_01 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                       ,0x49,"callbacks_","uint64_value (1)");
  this_03 = (mock_json_callbacks *)0x1;
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_01,1);
  testing::internal::MockSpec<std::error_code_(unsigned_long)>::~MockSpec(&local_58);
  testing::Matcher<unsigned_long>::~Matcher(&local_70);
  local_88.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_end_array
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonArray).callbacks_,this_03);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_88,(WithoutMatchers *)((long)&p.coordinate_.row + 3),(void *)0x0);
  extensions = 0x1effd7;
  pTVar4 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0x4a,"callbacks_","end_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar4,1);
  testing::InSequence::~InSequence(&local_11);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)((long)&input.field_2 + 8),
             (json *)&(this->super_JsonArray).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0,
             extensions);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_150,"[ 1 ]",&local_151);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  sVar6 = pstore::gsl::make_span<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150)
  ;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )sVar6.storage_.super_extent_type<_1L>.size_;
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
  input<pstore::gsl::span<char_const,_1l>>
            ((parser<callbacks_proxy<mock_json_callbacks>> *)(input.field_2._M_local_buf + 8),
             (span<const_char,__1L> *)&gtest_ar_.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)((long)&input.field_2 + 8));
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::last_error
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)((long)&input.field_2 + 8));
  local_179 = std::error_code::operator_cast_to_bool(this_02);
  local_179 = !local_179;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_178,&local_179,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    message = testing::Message::operator<<
                        (&local_188,(char (*) [36])"Expected the parse error to be zero");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_178,
               (AssertionResult *)"p.last_error ()","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x50,pcVar5);
    testing::internal::AssertHelper::operator=(&local_190,message);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1c8 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::coordinate
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)((long)&input.field_2 + 8)
                        );
  iVar2 = std::__cxx11::string::length();
  pstore::json::coord::coord(&local_1d0,iVar2 + 1,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_1c0,"p.coordinate ()",
             "(json::coord{static_cast<unsigned> (input.length ()) + 1U, 1U})",&local_1c8,&local_1d0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x51,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::__cxx11::string::~string((string *)local_150);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)((long)&input.field_2 + 8));
  return;
}

Assistant:

TEST_F (JsonArray, SingleElement) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_array ()).Times (1);
        EXPECT_CALL (callbacks_, uint64_value (1)).Times (1);
        EXPECT_CALL (callbacks_, end_array ()).Times (1);
    }
    auto p = json::make_parser (proxy_);
    std::string const input = "[ 1 ]";
    p.input (gsl::make_span (input));
    p.eof ();
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{static_cast<unsigned> (input.length ()) + 1U, 1U}));
}